

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,InitializationSkipping *is,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  Marray<int,_std::allocator<unsigned_long>_> *end_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  unsigned_long __n;
  int *data;
  size_t size;
  allocator<int> local_39;
  allocator_type *local_38;
  allocator_type *allocator_local;
  CoordinateOrder *coordinateOrder_local;
  InitializationSkipping *is_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  local_38 = allocator;
  allocator_local = (allocator_type *)coordinateOrder;
  coordinateOrder_local = (CoordinateOrder *)is;
  is_local = (InitializationSkipping *)this;
  this_local = (Marray<int,_std::allocator<unsigned_long>_> *)end._M_current;
  end_local = begin;
  std::allocator<int>::allocator(&local_39);
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,&local_39);
  std::allocator<int>::~allocator(&local_39);
  std::allocator<int>::allocator((allocator<int> *)(this + 0x40),local_38);
  __n = std::
        accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,std::multiplies<unsigned_long>>
                  (end_local._M_current,this_local,1);
  marray_detail::Assert<bool>(__n != 0);
  begin_00 = end_local;
  end_00 = this_local;
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )end_00,data,(CoordinateOrder *)allocator_local,(CoordinateOrder *)allocator_local,
             local_38);
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const InitializationSkipping& is,
    ShapeIterator begin,
    ShapeIterator end,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    testInvariant();
}